

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.hpp
# Opt level: O2

void __thiscall
glu::TextureTestUtil::ReferenceParams::ReferenceParams(ReferenceParams *this,TextureType texType_)

{
  RenderParams::RenderParams(&this->super_RenderParams,texType_);
  tcu::Sampler::Sampler(&this->sampler);
  this->lodMode = LODMODE_EXACT;
  this->minLod = -1000.0;
  this->maxLod = 1000.0;
  this->baseLevel = 0;
  this->maxLevel = 1000;
  return;
}

Assistant:

ReferenceParams (TextureType texType_)
		: RenderParams	(texType_)
		, sampler		()
		, lodMode		(LODMODE_EXACT)
		, minLod		(-1000.0f)
		, maxLod		(1000.0f)
		, baseLevel		(0)
		, maxLevel		(1000)
	{
	}